

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecChoice.c
# Opt level: O0

int Cec_ManCombSpecReal(Gia_Man_t *pNew,Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int iLit1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  Gia_Man_t *pNew_local;
  
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 != 0) {
    pGVar2 = Gia_ObjFanin0(pObj);
    Cec_ManCombSpecReduce_rec(pNew,p,pGVar2);
    pGVar2 = Gia_ObjFanin1(pObj);
    Cec_ManCombSpecReduce_rec(pNew,p,pGVar2);
    iVar1 = Gia_ObjFanin0Copy(pObj);
    iLit1 = Gia_ObjFanin1Copy(pObj);
    iVar1 = Gia_ManHashAnd(pNew,iVar1,iLit1);
    return iVar1;
  }
  __assert_fail("Gia_ObjIsAnd(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecChoice.c"
                ,0x36,"int Cec_ManCombSpecReal(Gia_Man_t *, Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int Cec_ManCombSpecReal( Gia_Man_t * pNew, Gia_Man_t * p, Gia_Obj_t * pObj )
{
    assert( Gia_ObjIsAnd(pObj) );
    Cec_ManCombSpecReduce_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Cec_ManCombSpecReduce_rec( pNew, p, Gia_ObjFanin1(pObj) );
    return Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
}